

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Asyncify.cpp
# Opt level: O2

void __thiscall
wasm::ModAsyncify<true,_false,_true>::visitCall(ModAsyncify<true,_false,_true> *this,Call *curr)

{
  Function *pFVar1;
  
  this->unwinding = false;
  pFVar1 = Module::getFunction((this->
                               super_WalkerPass<wasm::LinearExecutionWalker<wasm::ModAsyncify<true,_false,_true>,_wasm::Visitor<wasm::ModAsyncify<true,_false,_true>,_void>_>_>
                               ).
                               super_LinearExecutionWalker<wasm::ModAsyncify<true,_false,_true>,_wasm::Visitor<wasm::ModAsyncify<true,_false,_true>,_void>_>
                               .
                               super_PostWalker<wasm::ModAsyncify<true,_false,_true>,_wasm::Visitor<wasm::ModAsyncify<true,_false,_true>,_void>_>
                               .
                               super_Walker<wasm::ModAsyncify<true,_false,_true>,_wasm::Visitor<wasm::ModAsyncify<true,_false,_true>,_void>_>
                               .currModule,(Name)(curr->target).super_IString.str);
  if ((pFVar1->super_Importable).module.super_IString.str._M_str != (char *)0x0) {
    this->unwinding = true;
  }
  return;
}

Assistant:

void visitCall(Call* curr) {
    unsetUnwinding();
    if (!importsAlwaysUnwind) {
      return;
    }
    auto* target = this->getModule()->getFunction(curr->target);
    if (!target->imported()) {
      return;
    }
    // This is an import that definitely unwinds. Await the next check of
    // the state in this linear execution trace, which we can turn into a
    // constant.
    this->unwinding = true;
  }